

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

void pax_time(char *p,int64_t *ps,long *pn)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  long lVar6;
  char *pcVar7;
  
  cVar1 = *p;
  pcVar7 = p + (cVar1 == '-');
  cVar5 = p[cVar1 == '-'];
  if ((byte)(cVar5 - 0x30U) < 10) {
    lVar3 = 0;
    do {
      if ((0xccccccccccccccc < lVar3) || (lVar3 == 0xccccccccccccccc && 7 < (byte)(cVar5 - 0x30U)))
      {
        lVar3 = 0x7fffffffffffffff;
        break;
      }
      lVar3 = (ulong)(byte)(cVar5 - 0x30U) + lVar3 * 10;
      cVar5 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while ((byte)(cVar5 - 0x30U) < 10);
  }
  else {
    lVar3 = 0;
  }
  lVar6 = -lVar3;
  if (cVar1 != '-') {
    lVar6 = lVar3;
  }
  *ps = lVar6;
  *pn = 0;
  if (*pcVar7 == '.') {
    uVar4 = 100000000;
    do {
      pcVar7 = pcVar7 + 1;
      if (9 < (byte)(*pcVar7 - 0x30U)) {
        return;
      }
      *pn = *pn + (byte)(*pcVar7 - 0x30U) * uVar4;
      bVar2 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar2);
  }
  return;
}

Assistant:

static void
pax_time(const char *p, int64_t *ps, long *pn)
{
	char digit;
	int64_t	s;
	unsigned long l;
	int sign;
	int64_t limit, last_digit_limit;

	limit = INT64_MAX / 10;
	last_digit_limit = INT64_MAX % 10;

	s = 0;
	sign = 1;
	if (*p == '-') {
		sign = -1;
		p++;
	}
	while (*p >= '0' && *p <= '9') {
		digit = *p - '0';
		if (s > limit ||
		    (s == limit && digit > last_digit_limit)) {
			s = INT64_MAX;
			break;
		}
		s = (s * 10) + digit;
		++p;
	}

	*ps = s * sign;

	/* Calculate nanoseconds. */
	*pn = 0;

	if (*p != '.')
		return;

	l = 100000000UL;
	do {
		++p;
		if (*p >= '0' && *p <= '9')
			*pn += (*p - '0') * l;
		else
			break;
	} while (l /= 10);
}